

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O0

string * __thiscall
Kraken::KClient::public_method
          (string *__return_storage_ptr__,KClient *this,string *method,KInput *input)

{
  CURL *pCVar1;
  int iVar2;
  undefined8 uVar3;
  ostream *poVar4;
  char *pcVar5;
  runtime_error *this_00;
  string local_278 [32];
  ostringstream local_258 [8];
  ostringstream oss;
  CURLcode result;
  string postdata;
  string method_url;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string path;
  KInput *input_local;
  string *method_local;
  KClient *this_local;
  string *response;
  
  path.field_2._8_8_ = input;
  std::operator+(&local_88,"/",&this->version_);
  std::operator+(&local_68,&local_88,"/public/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,method);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&postdata.field_2 + 8),&this->url_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  pCVar1 = this->curl_;
  uVar3 = std::__cxx11::string::c_str();
  curl_easy_setopt(pCVar1,0x2712,uVar3);
  build_query((string *)&result,(KInput *)path.field_2._8_8_);
  pCVar1 = this->curl_;
  uVar3 = std::__cxx11::string::c_str();
  curl_easy_setopt(pCVar1,0x271f,uVar3);
  curl_easy_setopt(this->curl_,0x2727,0);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  curl_easy_setopt(this->curl_,0x2711,__return_storage_ptr__);
  iVar2 = curl_easy_perform(this->curl_);
  if (iVar2 == 0) {
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)(postdata.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_48);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream(local_258);
  poVar4 = std::operator<<((ostream *)local_258,"curl_easy_perform() failed: ");
  pcVar5 = (char *)curl_easy_strerror(iVar2);
  std::operator<<(poVar4,pcVar5);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this_00,local_278);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string KClient::public_method(const std::string& method, 
				const KInput& input) const
{
   // build method URL
   std::string path = "/" + version_ + "/public/" + method;
   std::string method_url = url_ + path;   
   curl_easy_setopt(curl_, CURLOPT_URL, method_url.c_str());

   // build postdata 
   std::string postdata = build_query(input);
   curl_easy_setopt(curl_, CURLOPT_POSTFIELDS, postdata.c_str());

   // reset the http header
   curl_easy_setopt(curl_, CURLOPT_HTTPHEADER, NULL);

   // where CURL write callback function stores the response
   std::string response;
   curl_easy_setopt(curl_, CURLOPT_WRITEDATA, static_cast<void*>(&response));
 
   // perform CURL request
   CURLcode result = curl_easy_perform(curl_);
   if (result != CURLE_OK) {
      std::ostringstream oss;  
      oss << "curl_easy_perform() failed: "<< curl_easy_strerror(result);
      throw std::runtime_error(oss.str());
   }

   return response;
}